

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
::~InstanceFactory1(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
                    *this)

{
  InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
  *this_local;
  
  ~InstanceFactory1(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

InstanceFactory1	(tcu::TestContext& testCtx, tcu::TestNodeType type, const std::string& name, const std::string& desc, const Arg0& arg0)
						: TestCase	(testCtx, type, name, desc)
						, m_progs	()
						, m_arg0	(arg0)
					{}